

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void __thiscall Screen_Manager::~Screen_Manager(Screen_Manager *this)

{
  Screen_Info *pSVar1;
  Screen_Info *this_00;
  
  this_00 = this->head;
  if (this_00 != (Screen_Info *)0x0) {
    do {
      pSVar1 = this_00->next;
      Screen_Info::~Screen_Info(this_00);
      operator_delete(this_00);
      this_00 = pSVar1;
    } while (pSVar1 != this->head);
  }
  return;
}

Assistant:

Screen_Manager::~Screen_Manager()
{
  if (head != nullptr) {
    Screen_Info *screen = head;
    do {
      Screen_Info *next_screen = screen->next;
      delete screen;
      screen = next_screen;
    } while (screen != head);
  }
}